

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O0

CharString * __thiscall
CFFFileInput::GetGlyphCharString
          (CFFFileInput *this,unsigned_short inFontIndex,unsigned_short inCharStringIndex)

{
  Trace *pTVar1;
  unsigned_short inCharStringIndex_local;
  unsigned_short inFontIndex_local;
  CFFFileInput *this_local;
  
  if (inFontIndex < this->mFontsCount) {
    if (inCharStringIndex < this->mCharStrings[inFontIndex].mCharStringsCount) {
      this_local = (CFFFileInput *)
                   (this->mCharStrings[inFontIndex].mCharStringsIndex + (int)(uint)inCharStringIndex
                   );
    }
    else {
      pTVar1 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar1,
                        "CFFFileInput::CalculateDependenciesForCharIndex, inCharStringIndex = %d is invalid. there are %d charsringd in the CFF segment for the requested font"
                        ,(ulong)inCharStringIndex,
                        (ulong)this->mCharStrings[inFontIndex].mCharStringsCount);
      this_local = (CFFFileInput *)0x0;
    }
  }
  else {
    pTVar1 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar1,
                      "CFFFileInput::CalculateDependenciesForCharIndex, inFontIndex = %d is invalid. there are %d fonts in the CFF segment"
                      ,(ulong)inFontIndex,(ulong)this->mFontsCount);
    this_local = (CFFFileInput *)0x0;
  }
  return (CharString *)this_local;
}

Assistant:

CharString* CFFFileInput::GetGlyphCharString(unsigned short inFontIndex,
											 unsigned short inCharStringIndex)
{
	if(inFontIndex >= mFontsCount)
	{
		TRACE_LOG2("CFFFileInput::CalculateDependenciesForCharIndex, inFontIndex = %d is invalid. there are %d fonts in the CFF segment",inFontIndex,mFontsCount);
		return NULL;
	}

	if(mCharStrings[inFontIndex].mCharStringsCount <= inCharStringIndex)
	{
		TRACE_LOG2("CFFFileInput::CalculateDependenciesForCharIndex, inCharStringIndex = %d is invalid. there are %d charsringd in the CFF segment for the requested font",
																														inCharStringIndex,mCharStrings[inFontIndex].mCharStringsCount);
		return NULL;
	}

	return mCharStrings[inFontIndex].mCharStringsIndex + inCharStringIndex;
}